

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# posix.cc
# Opt level: O1

ssize_t __thiscall fmt::File::write(File *this,int __fd,void *__buf,size_t __n)

{
  ssize_t sVar1;
  int *piVar2;
  SystemError *this_00;
  undefined4 in_register_00000034;
  
  do {
    sVar1 = ::write(this->fd_,(void *)CONCAT44(in_register_00000034,__fd),(size_t)__buf);
    if (sVar1 != -1) break;
    piVar2 = __errno_location();
  } while (*piVar2 == 4);
  if (-1 < sVar1) {
    return sVar1;
  }
  this_00 = (SystemError *)__cxa_allocate_exception(0x18);
  piVar2 = __errno_location();
  SystemError::SystemError(this_00,*piVar2,(CStringRef)0x22db3b);
  __cxa_throw(this_00,&SystemError::typeinfo,SystemError::~SystemError);
}

Assistant:

std::size_t fmt::File::write(const void *buffer, std::size_t count) {
  RWResult result = 0;
  FMT_RETRY(result, FMT_POSIX_CALL(write(fd_, buffer, convert_rwcount(count))));
  if (result < 0)
    FMT_THROW(SystemError(errno, "cannot write to file"));
  return internal::to_unsigned(result);
}